

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  undefined8 uVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  Result RVar5;
  pointer *__ptr;
  Import *pIVar6;
  long lVar7;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> import_1;
  string name;
  Location loc;
  string field_name;
  string module_name;
  Import *local_128;
  undefined1 local_120 [32];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 local_e0 [4];
  Enum local_dc;
  string local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a8;
  undefined8 uStack_a0;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_120,this);
  local_a8.offset = local_120._16_8_;
  uStack_a0 = local_120._24_8_;
  local_b8 = (Import *)local_120._0_8_;
  uStack_b0 = local_120._8_8_;
  CheckImportOrdering(this,module);
  RVar3 = Expect(this,Import);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  RVar3 = ParseQuotedText(this,&local_50);
  RVar5.enum_ = Error;
  if (((RVar3.enum_ == Error) || (RVar3 = ParseQuotedText(this,&local_70), RVar3.enum_ == Error)) ||
     (RVar3 = Expect(this,Lpar), RVar3.enum_ == Error)) goto LAB_00188e7b;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  TVar4 = Peek(this,0);
  if ((int)TVar4 < 0x19) {
    if (TVar4 == Event) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::EventImport,std::__cxx11::string&>((wabt *)local_120,&local_d8);
      RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                   ((long)&(((Import *)(local_120._0_8_ + 0x50))->module_name).
                                           field_2 + 8));
      pIVar6 = (Import *)local_120._0_8_;
      if (RVar3.enum_ == Error) goto LAB_00188e57;
      RVar3 = ParseUnboundFuncSignature
                        (this,(FuncSignature *)
                              ((long)&(((Import *)(local_120._0_8_ + 0xa0))->module_name).field_2 +
                              8));
LAB_00188e37:
      pIVar6 = (Import *)local_120._0_8_;
      if ((RVar3.enum_ == Error) ||
         (RVar3 = Expect(this,Rpar), pIVar6 = (Import *)local_120._0_8_, RVar3.enum_ == Error))
      goto LAB_00188e57;
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           operator_new(0x48);
      uVar1 = local_120._0_8_;
      local_120._0_8_ = (Import *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField._vptr_ModuleField =
           (_func_int **)&PTR__ModuleField_0020d4a0;
      *(undefined4 *)
       &(((ImportModuleField *)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.data_ =
           (undefined4)local_b8;
      *(undefined4 *)
       ((long)&(((ImportModuleField *)
                local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.
               data_ + 4) = local_b8._4_4_;
      *(undefined4 *)
       &(((ImportModuleField *)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.size_ =
           (undefined4)uStack_b0;
      *(undefined4 *)
       ((long)&(((ImportModuleField *)
                local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename.
               size_ + 4) = uStack_b0._4_4_;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.line =
           (int)local_a8.offset;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.
      first_column = local_a8.offset._4_4_;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_0.
      last_column = (int)uStack_a0;
      *(undefined4 *)
       ((long)&(((ImportModuleField *)
                local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1 + 0xc
       ) = uStack_a0._4_4_;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.type_ = Import;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField._vptr_ModuleField =
           (_func_int **)&PTR__ImportModuleField_0020dca8;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = (Import *)uVar1;
LAB_001890e0:
      std::__cxx11::string::_M_assign
                ((string *)
                 (*(long *)&((ImportModuleField *)
                            local_90._M_t.
                            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                            import + 8));
      std::__cxx11::string::_M_assign
                ((string *)
                 (*(long *)&((ImportModuleField *)
                            local_90._M_t.
                            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                            import + 0x28));
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_90);
      if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           )local_90._M_t.
            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
          (ImportModuleField *)0x0) {
        (**(code **)(*(long *)local_90._M_t.
                              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl
                    + 8))();
      }
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            )0x0;
      RVar3 = Expect(this,Rpar);
      RVar5.enum_ = (Enum)(RVar3.enum_ == Error);
    }
    else {
      if (TVar4 == Global) {
        Consume((Token *)local_120,this);
        ParseBindVarOpt(this,&local_d8);
        MakeUnique<wabt::GlobalImport,std::__cxx11::string&>((wabt *)local_120,&local_d8);
        RVar3 = ParseGlobalType(this,(Global *)(local_120._0_8_ + 0x50));
        goto LAB_00188e37;
      }
LAB_00188eb3:
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"an external kind","");
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (string *)local_120);
      RVar5 = ErrorExpected(this,&local_88,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      if ((Import *)local_120._0_8_ != (Import *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_);
      }
    }
  }
  else {
    if (TVar4 == Memory) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::MemoryImport,std::__cxx11::string&>((wabt *)local_120,&local_d8);
      RVar3 = ParseLimitsIndex(this,(Limits *)
                                    ((long)&(((Import *)(local_120._0_8_ + 0x50))->module_name).
                                            field_2 + 8));
      pIVar6 = (Import *)local_120._0_8_;
      if (RVar3.enum_ != Error) {
        RVar3 = ParseLimits(this,(Limits *)
                                 ((long)&(((Import *)(local_120._0_8_ + 0x50))->module_name).field_2
                                 + 8));
        goto LAB_00188e37;
      }
    }
    else {
      if (TVar4 != Table) {
        if (TVar4 != First_RefKind) goto LAB_00188eb3;
        Consume((Token *)local_120,this);
        ParseBindVarOpt(this,&local_d8);
        MakeUnique<wabt::FuncImport,std::__cxx11::string&>((wabt *)&local_128,&local_d8);
        bVar2 = PeekMatchLpar(this,Type);
        if (!bVar2) {
          RVar3 = ParseFuncSignature(this,(FuncSignature *)
                                          ((long)&local_128[2].module_name.field_2 + 8),
                                     (BindingHash *)&local_128[3].module_name.field_2);
          pIVar6 = local_128;
          if (RVar3.enum_ != Error) {
            local_120._0_8_ = local_120 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"param","");
            local_100[0] = local_f0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"result","");
            local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_88,(string *)local_120,local_e0);
            lVar7 = 0;
            local_dc = (Enum)ErrorIfLpar(this,&local_88,(char *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_88);
            do {
              if (local_f0 + lVar7 != *(undefined1 **)((long)local_100 + lVar7)) {
                operator_delete(*(undefined1 **)((long)local_100 + lVar7));
              }
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != -0x40);
            pIVar6 = local_128;
            if (local_dc != Error) goto LAB_00189069;
          }
          goto LAB_00188e57;
        }
        local_128[1].module_name.field_2._M_local_buf[8] = '\x01';
        RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                     ((long)&local_128[1].module_name.field_2 + 8));
        pIVar6 = local_128;
        if (RVar3.enum_ == Error) goto LAB_00188e57;
LAB_00189069:
        RVar3 = Expect(this,Rpar);
        pIVar6 = local_128;
        if (RVar3.enum_ == Error) goto LAB_00188e57;
        local_90._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             operator_new(0x48);
        pIVar6 = local_128;
        local_128 = (Import *)0x0;
        *(long *)((long)local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) =
             0;
        *(long *)((long)local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10
                 ) = 0;
        *(undefined ***)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ModuleField_0020d4a0;
        *(undefined4 *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
             (undefined4)local_b8;
        *(undefined4 *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x1c) =
             local_b8._4_4_;
        *(undefined4 *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20) =
             (undefined4)uStack_b0;
        *(undefined4 *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x24) =
             uStack_b0._4_4_;
        *(int *)((long)local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28)
             = (int)local_a8.offset;
        *(int *)((long)local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x2c)
             = local_a8.offset._4_4_;
        *(int *)((long)local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30)
             = (int)uStack_a0;
        *(undefined4 *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x34) =
             uStack_a0._4_4_;
        *(undefined4 *)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
        *(undefined ***)
         local_90._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ImportModuleField_0020dca8;
        *(Import **)
         ((long)local_90._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) =
             pIVar6;
        goto LAB_001890e0;
      }
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,&local_d8);
      MakeUnique<wabt::TableImport,std::__cxx11::string&>((wabt *)local_120,&local_d8);
      RVar3 = ParseLimits(this,(Limits *)
                               ((long)&(((Import *)(local_120._0_8_ + 0x50))->module_name).field_2 +
                               8));
      pIVar6 = (Import *)local_120._0_8_;
      if (RVar3.enum_ != Error) {
        RVar3 = ParseRefType(this,(Type *)&(((Import *)(local_120._0_8_ + 0x50))->field_name).
                                           field_2);
        goto LAB_00188e37;
      }
    }
LAB_00188e57:
    if (pIVar6 != (Import *)0x0) {
      (*pIVar6->_vptr_Import[1])();
    }
    RVar5.enum_ = Error;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
LAB_00188e7b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (Result)RVar5.enum_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<FuncImport>(name);
      if (PeekMatchLpar(TokenType::Type)) {
        import->func.decl.has_func_type = true;
        CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
        EXPECT(Rpar);
      } else {
        CHECK_RESULT(
            ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
        CHECK_RESULT(ErrorIfLpar({"param", "result"}));
        EXPECT(Rpar);
      }
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<TableImport>(name);
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<MemoryImport>(name);
      CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Event: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<EventImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->event.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->event.decl.sig));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}